

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O2

QString * __thiscall
QAccessibleComboBox::localizedActionDescription
          (QString *__return_storage_ptr__,QAccessibleComboBox *this,QString *actionName)

{
  bool bVar1;
  QString *pQVar2;
  
  pQVar2 = (QString *)QAccessibleActionInterface::showMenuAction();
  bVar1 = ::comparesEqual(actionName,pQVar2);
  if (!bVar1) {
    pQVar2 = (QString *)QAccessibleActionInterface::pressAction();
    bVar1 = ::comparesEqual(actionName,pQVar2);
    if (!bVar1) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  QComboBox::tr(__return_storage_ptr__,"Open the combo box selection popup",(char *)0x0,-1);
  return __return_storage_ptr__;
}

Assistant:

QString QAccessibleComboBox::localizedActionDescription(const QString &actionName) const
{
    if (actionName == showMenuAction() || actionName == pressAction())
        return QComboBox::tr("Open the combo box selection popup");
    return QString();
}